

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::SweepWeakReference(Recycler *this)

{
  RecyclerWeakReferenceBase *pRVar1;
  Type pRVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Type *pTVar8;
  HeapBlock *pHVar9;
  uint i;
  ulong uVar10;
  NodeBase *pNVar11;
  void *candidate;
  Type *ppRVar12;
  uint removed;
  uint uVar13;
  Type pRVar14;
  Type TVar15;
  uint countedEntries;
  uint uVar16;
  undefined8 *in_FS_OFFSET;
  undefined1 local_60 [8];
  EditingIterator edIt;
  undefined4 *local_38;
  
  edIt.super_EditingIterator.last = (NodeBase *)0x0;
  uVar10 = 0;
  uVar13 = 0;
  uVar16 = 0;
LAB_0028bc28:
  pNVar11 = edIt.super_EditingIterator.last;
  if (uVar10 < (this->weakReferenceMap).size) {
    ppRVar12 = (this->weakReferenceMap).buckets + uVar10;
LAB_0028bc44:
    do {
      pRVar1 = *ppRVar12;
      if (pRVar1 == (RecyclerWeakReferenceBase *)0x0) goto LAB_0028bc9d;
      iVar6 = (*pRVar1->weakRefHeapBlock->_vptr_HeapBlock[0xb])(pRVar1->weakRefHeapBlock,pRVar1);
      if ((char)iVar6 != '\0') {
        iVar6 = (*pRVar1->strongRefHeapBlock->_vptr_HeapBlock[0xb])
                          (pRVar1->strongRefHeapBlock,pRVar1->strongRef);
        if ((char)iVar6 != '\0') {
          ppRVar12 = &pRVar1->next;
          uVar16 = uVar16 + 1;
          goto LAB_0028bc44;
        }
        pRVar1->strongRef = (Type)0x0;
        pRVar1->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance.super_HeapBlock;
      }
      pRVar2 = pRVar1->next;
      *ppRVar12 = pRVar2;
      uVar13 = uVar13 + 1;
      edIt.super_EditingIterator.last = (NodeBase *)CONCAT71((int7)((ulong)pRVar2 >> 8),1);
    } while( true );
  }
  uVar7 = (this->weakReferenceMap).count;
  if (uVar7 < uVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x107,"(removed <= count)","removed <= count");
    if (!bVar5) goto LAB_0028beb4;
    *puVar3 = 0;
    uVar7 = (this->weakReferenceMap).count;
  }
  (this->weakReferenceMap).count = uVar7 - uVar13;
  if (uVar16 == uVar7 - uVar13) {
    local_38 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)*in_FS_OFFSET;
    *local_38 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x10b,"(countedEntries == count)","countedEntries == count");
    if (!bVar5) {
LAB_0028beb4:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *local_38 = 0;
  }
  local_60 = (undefined1  [8])&this->weakReferenceRegionList;
  edIt.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  edIt.super_EditingIterator.super_Iterator.list =
       (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)local_60;
  do {
    while( true ) {
      bVar5 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_60);
      if (!bVar5) {
        this->weakReferenceCleanupId = this->weakReferenceCleanupId + ((uint)pNVar11 & 0xff);
        return;
      }
      pTVar8 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data((Iterator *)local_60);
      pRVar14 = pTVar8->ptr;
      TVar15 = pTVar8->count;
      iVar6 = (*pTVar8->arrayHeapBlock->_vptr_HeapBlock[0xb])(pTVar8->arrayHeapBlock,pRVar14);
      if ((char)iVar6 != '\0') break;
      SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::EditingIterator
      ::RemoveCurrent((EditingIterator *)local_60);
      pNVar11 = (NodeBase *)&DAT_00000001;
    }
    pRVar14 = pRVar14 + 8;
    while (bVar5 = TVar15 != 0, TVar15 = TVar15 - 1, bVar5) {
      candidate = *(void **)(pRVar14 + -8);
      if (candidate != (void *)0x0) {
        pHVar9 = *(HeapBlock **)pRVar14;
        if (((ulong)pHVar9 & 1) == 0) {
          if (pHVar9 == (HeapBlock *)0x0) {
            pHVar9 = FindHeapBlock(this,candidate);
            if (pHVar9 == (HeapBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_38 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                 ,0xcb0,"(false)",
                                 "WeakReferenceRegionItems should only contain recycler references")
              ;
              if (bVar5) {
                *local_38 = 0;
                goto LAB_0028be33;
              }
              goto LAB_0028beb4;
            }
            *(HeapBlock **)pRVar14 = pHVar9;
            candidate = *(void **)(pRVar14 + -8);
          }
          iVar6 = (*pHVar9->_vptr_HeapBlock[0xb])(pHVar9,candidate);
          if ((char)iVar6 == '\0') {
            *(ulong *)(pRVar14 + -8) = 0;
            *(ulong *)pRVar14 = 0;
            pNVar11 = (NodeBase *)&DAT_00000001;
          }
        }
        else {
          *(ulong *)pRVar14 = (ulong)pHVar9 & 0xfffffffffffffffe;
        }
      }
LAB_0028be33:
      pRVar14 = pRVar14 + 0x10;
    }
  } while( true );
LAB_0028bc9d:
  uVar10 = uVar10 + 1;
  goto LAB_0028bc28;
}

Assistant:

void
Recycler::SweepWeakReference()
{
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::SweepWeakPhase);
    GCETW(GC_SWEEP_WEAKREF_START, (this));

    // REVIEW: Clean up the weak reference map concurrently?
    bool hasCleanup = false;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint scannedCount = weakReferenceMap.Count();
#endif

    weakReferenceMap.Map([&hasCleanup](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        if (!weakRef->weakRefHeapBlock->TestObjectMarkedBit(weakRef))
        {
            hasCleanup = true;

            // Remove
            return false;
        }

        if (!weakRef->strongRefHeapBlock->TestObjectMarkedBit(weakRef->strongRef))
        {
            hasCleanup = true;
            weakRef->strongRef = nullptr;

            // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
            weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

            // Remove
            return false;
        }

        return true;
    });

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint regionScannedCount = 0;
    uint regionClearedCount = 0;
#endif

#if ENABLE_WEAK_REFERENCE_REGIONS

    auto edIt = this->weakReferenceRegionList.GetEditingIterator();
    while (edIt.Next())
    {
        RecyclerWeakReferenceRegion region = edIt.Data();
        // We want to see if user code has any reference to the region, if not, we can free the whole thing
        if (!region.GetHeapBlock()->TestObjectMarkedBit(region.GetPtr()))
        {
            edIt.RemoveCurrent();
            hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
            regionClearedCount += (uint)region.GetCount();
#endif
            continue;
        }

        // The region is referenced, clean up any stale weak references
        RecyclerWeakReferenceRegionItem<void*>* refs = region.GetPtr();
#if defined(GCETW) && defined(ENABLE_JS_ETW)
        regionScannedCount += (uint)region.GetCount();
#endif
        for (size_t i = 0; i < region.GetCount(); ++i)
        {
            RecyclerWeakReferenceRegionItem<void*> &ref = refs[i];
            if (ref.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)ref.heapBlock & 0x1) == 0x1)
            {
                // Background thread marked this ref. Unmark it, and keep it
                ref.heapBlock = (HeapBlock*)((uintptr_t)ref.heapBlock & ~0x1);
                continue;
            }

            if (ref.heapBlock == nullptr)
            {
                HeapBlock* block = this->FindHeapBlock(ref.ptr);
                if (block == nullptr)
                {
                    // This is not a real reference
                    AssertMsg(false, "WeakReferenceRegionItems should only contain recycler references");
                    continue;
                }
                else
                {
                    ref.heapBlock = block;
                }
            }

            if (!ref.heapBlock->TestObjectMarkedBit(ref))
            {
                ref.ptr = nullptr;
                ref.heapBlock = nullptr;
                hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
                regionClearedCount++;
#endif
            }
        }
    }
#endif

    this->weakReferenceCleanupId += hasCleanup;

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    const uint keptCount = weakReferenceMap.Count();
    GCETW(GC_SWEEP_WEAKREF_STOP_EX, (this, scannedCount, (scannedCount - keptCount), regionScannedCount, regionClearedCount));
#endif

    RECYCLER_PROFILE_EXEC_END(this, Js::SweepWeakPhase);
}